

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.hxx
# Opt level: O0

limits * __thiscall nuraft::raft_server::limits::operator=(limits *this,limits *src)

{
  long in_RSI;
  limits *in_RDI;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined8 in_stack_fffffffffffffed0;
  __int_type_conflict __i;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  __i = (__int_type_conflict)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),__i
            );
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),__i
            );
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),__i
            );
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),__i
            );
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),__i
            );
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),__i
            );
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(5,in_stack_fffffffffffffed8),
             (__int_type_conflict)((ulong)(in_RSI + 0x18) >> 0x20));
  return in_RDI;
}

Assistant:

limits& operator=(const limits& src) {
            pre_vote_rejection_limit_ = src.pre_vote_rejection_limit_.load();
            warning_limit_ = src.warning_limit_.load();
            response_limit_ = src.response_limit_.load();
            leadership_limit_  = src.leadership_limit_.load();
            reconnect_limit_ = src.reconnect_limit_.load();
            leave_limit_ = src.leave_limit_.load();
            vote_limit_ = src.vote_limit_.load();
            return *this;
        }